

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O2

void ra_append_copies_after
               (roaring_array_t *ra,roaring_array_t *sa,uint16_t before_start,_Bool copy_on_write)

{
  uint uVar1;
  uint start_index;
  
  uVar1 = ra_get_index(sa,before_start);
  start_index = uVar1 + 1;
  if ((int)uVar1 < 0) {
    start_index = ~uVar1;
  }
  ra_append_copy_range(ra,sa,start_index,sa->size,copy_on_write);
  return;
}

Assistant:

void ra_append_copies_after(roaring_array_t *ra, const roaring_array_t *sa,
                            uint16_t before_start, bool copy_on_write) {
    int start_location = ra_get_index(sa, before_start);
    if (start_location >= 0)
        ++start_location;
    else
        start_location = -start_location - 1;
    ra_append_copy_range(ra, sa, start_location, sa->size, copy_on_write);
}